

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O0

void __thiscall
Js::JavascriptLibrary::CacheJsrtExternalType
          (JavascriptLibrary *this,uintptr_t traceCallback,uintptr_t finalizeCallback,
          uintptr_t prototype,JsrtExternalType *dynamicTypeToCache)

{
  WeakReferenceDictionary<Js::JavascriptLibrary::JsrtExternalCallbacks,_Js::DynamicType,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_DefaultComparer>
  *pWVar1;
  RecyclerWeakReference<Js::DynamicType> *local_50;
  JsrtExternalCallbacks local_48;
  JsrtExternalType *local_30;
  JsrtExternalType *dynamicTypeToCache_local;
  uintptr_t prototype_local;
  uintptr_t finalizeCallback_local;
  uintptr_t traceCallback_local;
  JavascriptLibrary *this_local;
  
  local_30 = dynamicTypeToCache;
  dynamicTypeToCache_local = (JsrtExternalType *)prototype;
  prototype_local = finalizeCallback;
  finalizeCallback_local = traceCallback;
  traceCallback_local = (uintptr_t)this;
  pWVar1 = Memory::
           WriteBarrierPtr<JsUtil::WeakReferenceDictionary<Js::JavascriptLibrary::JsrtExternalCallbacks,_Js::DynamicType,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_DefaultComparer>_>
           ::operator->(&this->jsrtExternalTypesCache);
  JsrtExternalCallbacks::JsrtExternalCallbacks
            (&local_48,finalizeCallback_local,prototype_local,(uintptr_t)dynamicTypeToCache_local);
  local_50 = Memory::Recycler::CreateWeakReferenceHandle<Js::DynamicType>
                       (this->recycler,&local_30->super_DynamicType);
  JsUtil::
  BaseDictionary<Js::JavascriptLibrary::JsrtExternalCallbacks,_Memory::RecyclerWeakReference<Js::DynamicType>_*,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::WeakRefValueDictionaryEntry,_JsUtil::NoResizeLock>
  ::Item(&pWVar1->
          super_BaseDictionary<Js::JavascriptLibrary::JsrtExternalCallbacks,_Memory::RecyclerWeakReference<Js::DynamicType>_*,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::WeakRefValueDictionaryEntry,_JsUtil::NoResizeLock>
         ,&local_48,&local_50);
  return;
}

Assistant:

void JavascriptLibrary::CacheJsrtExternalType(uintptr_t traceCallback, uintptr_t finalizeCallback, uintptr_t prototype, JsrtExternalType* dynamicTypeToCache)
    {
        jsrtExternalTypesCache->Item(JsrtExternalCallbacks(traceCallback, finalizeCallback, prototype), recycler->CreateWeakReferenceHandle<DynamicType>((DynamicType*)dynamicTypeToCache));
    }